

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

float Abc_SclComputeAreaClass(SC_Cell *pRepr)

{
  int iVar1;
  int local_24;
  int local_20;
  int Count;
  int i;
  float Area;
  SC_Cell *pCell;
  SC_Cell *pRepr_local;
  
  Count = 0;
  local_24 = 0;
  _i = pRepr;
  for (local_20 = 0; local_20 == 0 || _i != pRepr; local_20 = local_20 + 1) {
    if (_i->fSkip == 0) {
      Count = (int)(_i->area + (float)Count);
      local_24 = local_24 + 1;
    }
    _i = _i->pNext;
  }
  iVar1 = Abc_MaxInt(1,local_24);
  return (float)Count / (float)iVar1;
}

Assistant:

float Abc_SclComputeAreaClass( SC_Cell * pRepr )
{
    SC_Cell * pCell;
    float Area = 0;
    int i, Count = 0;
    SC_RingForEachCell( pRepr, pCell, i )
    {
        if ( pCell->fSkip ) 
            continue;
        Area += pCell->area;
        Count++;
    }
    return Area / Abc_MaxInt(1, Count);
}